

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

BlockHeader * __thiscall
cfd::core::Block::GetBlockHeader(BlockHeader *__return_storage_ptr__,Block *this)

{
  Block *this_local;
  
  BlockHeader::BlockHeader(__return_storage_ptr__,&this->header_);
  return __return_storage_ptr__;
}

Assistant:

BlockHeader Block::GetBlockHeader() const { return header_; }